

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QList<QByteArray> * __thiscall
QByteArray::split(QList<QByteArray> *__return_storage_ptr__,QByteArray *this,char sep)

{
  qsizetype qVar1;
  long from;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
  from = 0;
  while( true ) {
    qVar1 = indexOf(this,sep,from);
    if (qVar1 == -1) break;
    mid((QByteArray *)&local_50,this,from,qVar1 - from);
    QList<QByteArray>::emplaceBack<QByteArray>(__return_storage_ptr__,(QByteArray *)&local_50);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    from = qVar1 + 1;
  }
  mid((QByteArray *)&local_50,this,from,-1);
  QList<QByteArray>::emplaceBack<QByteArray>(__return_storage_ptr__,(QByteArray *)&local_50);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QByteArray::split(char sep) const
{
    QList<QByteArray> list;
    qsizetype start = 0;
    qsizetype end;
    while ((end = indexOf(sep, start)) != -1) {
        list.append(mid(start, end - start));
        start = end + 1;
    }
    list.append(mid(start));
    return list;
}